

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linear-algebra.cc
# Opt level: O1

float3 tinyusdz::geometric_normal(float3 *p0,float3 *p1,float3 *p2)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float3 fVar8;
  
  fVar1 = p1->_M_elems[0] - p0->_M_elems[0];
  fVar6 = p1->_M_elems[1] - p0->_M_elems[1];
  fVar5 = p1->_M_elems[2] - p0->_M_elems[2];
  fVar4 = p2->_M_elems[0] - p0->_M_elems[0];
  fVar2 = p2->_M_elems[1] - p0->_M_elems[1];
  fVar3 = p2->_M_elems[2] - p0->_M_elems[2];
  fVar7 = fVar6 * fVar3 - fVar2 * fVar5;
  fVar5 = fVar5 * fVar4 - fVar3 * fVar1;
  fVar2 = fVar2 * fVar1 - fVar4 * fVar6;
  fVar3 = fVar2 * fVar2 + fVar7 * fVar7 + fVar5 * fVar5;
  fVar1 = 0.0;
  if (1.1920929e-07 < fVar3) {
    if (fVar3 < 0.0) {
      fVar1 = sqrtf(fVar3);
    }
    else {
      fVar1 = SQRT(fVar3);
    }
  }
  if (fVar1 <= 1.1920929e-07) {
    fVar1 = 1.1920929e-07;
  }
  fVar8._M_elems[2] = fVar2 / fVar1;
  fVar8._M_elems[1] = fVar5 / fVar1;
  fVar8._M_elems[0] = fVar7 / fVar1;
  return (float3)fVar8._M_elems;
}

Assistant:

value::float3 geometric_normal(const value::float3 &p0, const value::float3 &p1, const value::float3 &p2)
{
  value::float3 n = vcross(p1 - p0, p2 - p0);

  return vnormalize(n);
}